

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseMessageEntity_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  char *this_00;
  char cVar6;
  string *psVar7;
  string *this_01;
  string local_68;
  string local_48;
  
  psVar7 = &local_68;
  this_01 = &local_68;
  peVar2 = (object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar6 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar6);
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"type","");
    appendToJson((TgTypeParser *)psVar7,__return_storage_ptr__,&local_68,
                 &((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"offset","");
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"length","");
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"url","");
    appendToJson((TgTypeParser *)this_01,__return_storage_ptr__,&local_68,
                 &((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->url);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    this_00 = "user";
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"user","");
    psVar7 = &local_48;
    parseUser_abi_cxx11_
              (psVar7,(TgTypeParser *)this_00,
               &((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->user);
    appendToJson((TgTypeParser *)psVar7,__return_storage_ptr__,&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    sVar5 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar3);
      }
      _Unwind_Resume(uVar4);
    }
    __return_storage_ptr__->_M_string_length = sVar5;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar5] = '\0';
    std::__cxx11::string::push_back(cVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseMessageEntity(const MessageEntity::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "type", object->type);
    appendToJson(result, "offset", object->offset);
    appendToJson(result, "length", object->length);
    appendToJson(result, "url", object->url);
    appendToJson(result, "user", parseUser(object->user));
    removeLastComma(result);
    result += '}';
    return result;
}